

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationBuilder::mergeCompositeIntoString
          (CollationBuilder *this,UnicodeString *nfdString,int32_t indexAfterLastStarter,
          UChar32 composite,UnicodeString *decomp,UnicodeString *newNFDString,
          UnicodeString *newString,UErrorCode *errorCode)

{
  ushort uVar1;
  int32_t iVar2;
  byte bVar3;
  short sVar4;
  int32_t srcStart;
  uint srcChar;
  int iVar5;
  uint srcChar_00;
  int iVar6;
  int iVar7;
  UnicodeString *this_00;
  int iVar8;
  char16_t *srcChars;
  int32_t iVar9;
  int iVar10;
  int local_54;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    srcStart = icu_63::UnicodeString::moveIndex32(decomp,0,1);
    uVar1 = (decomp->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      iVar9 = (decomp->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)(short)uVar1 >> 5;
    }
    if (srcStart == iVar9) {
      return '\0';
    }
    if (((int)(short)uVar1 & 1U) == 0) {
      iVar2 = srcStart;
      if (iVar9 < srcStart) {
        iVar2 = iVar9;
      }
      iVar5 = 0;
      if (-1 < srcStart) {
        iVar5 = iVar2;
      }
      if ((uVar1 & 2) == 0) {
        srcChars = (decomp->fUnion).fFields.fArray;
      }
      else {
        srcChars = (decomp->fUnion).fStackFields.fBuffer;
      }
      bVar3 = icu_63::UnicodeString::doCompare
                        (nfdString,indexAfterLastStarter,0x7fffffff,srcChars,iVar5,iVar9 - iVar5);
    }
    else {
      bVar3 = ~*(byte *)&nfdString->fUnion & 1;
    }
    if (bVar3 != 0) {
      icu_63::UnicodeString::unBogus(newNFDString);
      sVar4 = (newNFDString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar4 < 0) {
        iVar9 = (newNFDString->fUnion).fFields.fLength;
      }
      else {
        iVar9 = (int)sVar4 >> 5;
      }
      iVar5 = 0;
      icu_63::UnicodeString::doReplace(newNFDString,0,iVar9,nfdString,0,indexAfterLastStarter);
      icu_63::UnicodeString::unBogus(newString);
      sVar4 = (newString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar4 < 0) {
        iVar9 = (newString->fUnion).fFields.fLength;
      }
      else {
        iVar9 = (int)sVar4 >> 5;
      }
      this_00 = icu_63::UnicodeString::doReplace
                          (newString,0,iVar9,nfdString,0,indexAfterLastStarter - srcStart);
      icu_63::UnicodeString::append(this_00,composite);
      srcChar = 0xffffffff;
      iVar6 = 0;
      local_54 = indexAfterLastStarter;
      while( true ) {
        if ((int)srcChar < 0) {
          sVar4 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
          if (sVar4 < 0) {
            iVar5 = (nfdString->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar4 >> 5;
          }
          if (iVar5 <= local_54) {
            sVar4 = (decomp->fUnion).fStackFields.fLengthAndFlags;
            iVar7 = (decomp->fUnion).fFields.fLength;
            iVar8 = (int)sVar4 >> 5;
            goto LAB_00220b9d;
          }
          srcChar = icu_63::UnicodeString::char32At(nfdString,local_54);
          iVar5 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)srcChar);
        }
        sVar4 = (decomp->fUnion).fStackFields.fLengthAndFlags;
        iVar8 = (int)sVar4 >> 5;
        iVar7 = (decomp->fUnion).fFields.fLength;
        iVar10 = iVar8;
        if (sVar4 < 0) {
          iVar10 = iVar7;
        }
        bVar3 = (byte)iVar5;
        if (iVar10 <= srcStart) break;
        srcChar_00 = icu_63::UnicodeString::char32At(decomp,srcStart);
        iVar6 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)srcChar_00);
        if (bVar3 <= (byte)((byte)iVar6 - 1)) {
          return '\0';
        }
        if ((byte)iVar6 < bVar3) {
          icu_63::UnicodeString::append(newNFDString,srcChar_00);
          iVar7 = 2 - (uint)(srcChar_00 < 0x10000);
        }
        else {
          if (srcChar_00 != srcChar) {
            return '\0';
          }
          icu_63::UnicodeString::append(newNFDString,srcChar);
          iVar7 = 2 - (uint)(srcChar < 0x10000);
          local_54 = local_54 + iVar7;
          srcChar = 0xffffffff;
        }
        srcStart = srcStart + iVar7;
      }
      if ((int)srcChar < 0) {
LAB_00220b9d:
        if (sVar4 < 0) {
          iVar8 = iVar7;
        }
        if (srcStart < iVar8) {
          icu_63::UnicodeString::doAppend(newNFDString,decomp,srcStart,0x7fffffff);
          return '\x01';
        }
        return '\x01';
      }
      if ((byte)iVar6 <= bVar3) {
        icu_63::UnicodeString::doAppend(newNFDString,nfdString,local_54,0x7fffffff);
        icu_63::UnicodeString::doAppend(newString,nfdString,local_54,0x7fffffff);
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

UBool
CollationBuilder::mergeCompositeIntoString(const UnicodeString &nfdString,
                                           int32_t indexAfterLastStarter,
                                           UChar32 composite, const UnicodeString &decomp,
                                           UnicodeString &newNFDString, UnicodeString &newString,
                                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(nfdString.char32At(indexAfterLastStarter - 1) == decomp.char32At(0));
    int32_t lastStarterLength = decomp.moveIndex32(0, 1);
    if(lastStarterLength == decomp.length()) {
        // Singleton decompositions should be found by addWithClosure()
        // and the CanonicalIterator, so we can ignore them here.
        return FALSE;
    }
    if(nfdString.compare(indexAfterLastStarter, 0x7fffffff,
                         decomp, lastStarterLength, 0x7fffffff) == 0) {
        // same strings, nothing new to be found here
        return FALSE;
    }

    // Make new FCD strings that combine a composite, or its decomposition,
    // into the nfdString's last starter and the combining marks following it.
    // Make an NFD version, and a version with the composite.
    newNFDString.setTo(nfdString, 0, indexAfterLastStarter);
    newString.setTo(nfdString, 0, indexAfterLastStarter - lastStarterLength).append(composite);

    // The following is related to discontiguous contraction matching,
    // but builds only FCD strings (or else returns FALSE).
    int32_t sourceIndex = indexAfterLastStarter;
    int32_t decompIndex = lastStarterLength;
    // Small optimization: We keep the source character across loop iterations
    // because we do not always consume it,
    // and then need not fetch it again nor look up its combining class again.
    UChar32 sourceChar = U_SENTINEL;
    // The cc variables need to be declared before the loop so that at the end
    // they are set to the last combining classes seen.
    uint8_t sourceCC = 0;
    uint8_t decompCC = 0;
    for(;;) {
        if(sourceChar < 0) {
            if(sourceIndex >= nfdString.length()) { break; }
            sourceChar = nfdString.char32At(sourceIndex);
            sourceCC = nfd.getCombiningClass(sourceChar);
            U_ASSERT(sourceCC != 0);
        }
        // We consume a decomposition character in each iteration.
        if(decompIndex >= decomp.length()) { break; }
        UChar32 decompChar = decomp.char32At(decompIndex);
        decompCC = nfd.getCombiningClass(decompChar);
        // Compare the two characters and their combining classes.
        if(decompCC == 0) {
            // Unable to merge because the source contains a non-zero combining mark
            // but the composite's decomposition contains another starter.
            // The strings would not be equivalent.
            return FALSE;
        } else if(sourceCC < decompCC) {
            // Composite + sourceChar would not be FCD.
            return FALSE;
        } else if(decompCC < sourceCC) {
            newNFDString.append(decompChar);
            decompIndex += U16_LENGTH(decompChar);
        } else if(decompChar != sourceChar) {
            // Blocked because same combining class.
            return FALSE;
        } else {  // match: decompChar == sourceChar
            newNFDString.append(decompChar);
            decompIndex += U16_LENGTH(decompChar);
            sourceIndex += U16_LENGTH(decompChar);
            sourceChar = U_SENTINEL;
        }
    }
    // We are at the end of at least one of the two inputs.
    if(sourceChar >= 0) {  // more characters from nfdString but not from decomp
        if(sourceCC < decompCC) {
            // Appending the next source character to the composite would not be FCD.
            return FALSE;
        }
        newNFDString.append(nfdString, sourceIndex, 0x7fffffff);
        newString.append(nfdString, sourceIndex, 0x7fffffff);
    } else if(decompIndex < decomp.length()) {  // more characters from decomp, not from nfdString
        newNFDString.append(decomp, decompIndex, 0x7fffffff);
    }
    U_ASSERT(nfd.isNormalized(newNFDString, errorCode));
    U_ASSERT(fcd.isNormalized(newString, errorCode));
    U_ASSERT(nfd.normalize(newString, errorCode) == newNFDString);  // canonically equivalent
    return TRUE;
}